

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

char * xstrdup(char *s)

{
  size_t sVar1;
  size_t len;
  char *t;
  char *s_local;
  
  if (s == (char *)0x0) {
    s_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(s);
    s_local = (char *)malloc(sVar1 + 1);
    if (s_local != (char *)0x0) {
      memcpy(s_local,s,sVar1 + 1);
    }
  }
  return s_local;
}

Assistant:

static char * xstrdup(const char * s)
{
    char * t ;
    size_t len ;
    if (!s)
        return NULL ;

    len = strlen(s) + 1 ;
    t = (char*) malloc(len) ;
    if (t) {
        memcpy(t, s, len) ;
    }
    return t ;
}